

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

Matrix<double,_4,_4,_0,_4,_4> *
getGTTransformations<double>(Matrix<double,_4,_4,_0,_4,_4> *__return_storage_ptr__,bool verbose)

{
  int iVar1;
  ostream *poVar2;
  double *pdVar3;
  long lVar4;
  Scalar *dst_ptr;
  undefined7 in_register_00000031;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar15;
  undefined1 auVar14 [16];
  Matrix<double,_3,_1,_0,_3,_1> tranGT;
  Matrix<double,_3,_3,_0,_3,_3> rotGT;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  RotationBase<Eigen::Quaternion<double,_0>,_3> *local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  Matrix<double,3,3,0,3,3> local_68 [72];
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0] = 1.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[1] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[2] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[3] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[4] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[5] = 1.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[6] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[7] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[8] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[9] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[10] = 1.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xb] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xc] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xd] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = 0.0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xf] = 1.0;
  iVar1 = rand();
  dVar5 = (double)(iVar1 % 200) / 5.0;
  iVar1 = rand();
  dVar6 = (double)(iVar1 % 200) / 5.0;
  iVar1 = rand();
  dVar7 = (double)(iVar1 % 200) / 5.0;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Rand() angles = (",0x11);
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  dVar7 = ((dVar7 * 3.141592653589793) / 360.0) * 0.5;
  dVar8 = cos(dVar7);
  dVar7 = sin(dVar7);
  local_98 = dVar7 * 0.0;
  dVar6 = ((dVar6 * 3.141592653589793) / 360.0) * 0.5;
  dStack_90 = local_98;
  local_a8 = cos(dVar6);
  dVar6 = sin(dVar6);
  dVar13 = dVar6 * 0.0;
  dVar15 = dVar6 * 1.0;
  dVar6 = dVar6 * 0.0;
  dVar12 = dVar7 * dVar13 - local_98 * dVar6;
  auVar11._8_4_ = SUB84(dVar12,0);
  auVar11._0_8_ = dVar7 * dVar15 - dStack_90 * local_a8;
  auVar11._12_4_ = (int)((ulong)dVar12 >> 0x20);
  dVar10 = SUB168(auVar11 ^ _DAT_00227150,0) + dVar8 * dVar13 + local_98 * dVar6;
  dStack_80 = SUB168(auVar11 ^ _DAT_00227150,8) + dVar8 * dVar15 + dStack_90 * local_a8;
  dVar12 = -(dVar6 * dVar7 + dVar13 * local_98) + (dVar8 * local_a8 - dVar15 * dStack_90);
  dVar8 = local_a8 * dVar7 + dVar15 * dStack_90 + (dVar8 * dVar6 - dVar13 * local_98);
  dVar5 = ((dVar5 * 3.141592653589793) / 360.0) * 0.5;
  local_88 = (RotationBase<Eigen::Quaternion<double,_0>,_3> *)dVar10;
  local_78 = dVar8;
  dStack_70 = dVar12;
  dVar6 = cos(dVar5);
  dVar5 = sin(dVar5);
  dVar13 = dVar5 * 1.0;
  dVar15 = dVar5 * 0.0;
  dVar5 = dVar5 * 0.0;
  dVar7 = dVar13 * dVar8 - dVar5 * dVar10;
  auVar14._8_4_ = SUB84(dVar7,0);
  auVar14._0_8_ = dVar15 * dVar8 - dVar6 * dVar10;
  auVar14._12_4_ = (int)((ulong)dVar7 >> 0x20);
  local_c8 = SUB168(auVar14 ^ _DAT_00227150,0) + dStack_80 * dVar5 + dVar13 * dVar12;
  dStack_c0 = SUB168(auVar14 ^ _DAT_00227150,8) + dStack_80 * dVar6 + dVar15 * dVar12;
  dVar7 = dVar10 * dVar13 + dVar8 * dVar5;
  auVar9._8_4_ = SUB84(dVar7,0);
  auVar9._0_8_ = dVar10 * dVar15 + dVar8 * dVar6;
  auVar9._12_4_ = (int)((ulong)dVar7 >> 0x20);
  local_b8 = SUB168(auVar9 ^ _DAT_00227140,0) + (dVar12 * dVar5 - dStack_80 * dVar13);
  dStack_b0 = SUB168(auVar9 ^ _DAT_00227140,8) + (dVar12 * dVar6 - dStack_80 * dVar15);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            (local_68,(RotationBase<Eigen::Quaternion<double,_0>,_3> *)&local_c8);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GT Rotation Matrix: ",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    poVar2 = (ostream *)std::ostream::flush();
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_68);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  iVar1 = rand();
  local_c8 = (double)(iVar1 % 200) / 10.0 + -10.0;
  iVar1 = rand();
  dStack_c0 = (double)(iVar1 % 200) / 10.0 + -10.0;
  iVar1 = rand();
  local_b8 = (double)(iVar1 % 200) / 10.0 + -10.0;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GT Translation Vector: ",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    poVar2 = (ostream *)std::ostream::flush();
    local_88 = (RotationBase<Eigen::Quaternion<double,_0>,_3> *)&local_c8;
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&local_88);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  pdVar3 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
           m_storage.m_data.array + 2;
  lVar4 = 0x10;
  do {
    dVar5 = *(double *)(local_68 + lVar4 + -8);
    ((plain_array<double,_16,_0,_16> *)(pdVar3 + -2))->array[0] =
         *(double *)((long)&local_78 + lVar4);
    pdVar3[-1] = dVar5;
    *pdVar3 = *(double *)(local_68 + lVar4);
    lVar4 = lVar4 + 0x18;
    pdVar3 = pdVar3 + 4;
  } while (lVar4 != 0x58);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xc] = local_c8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xd] = dStack_c0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
  m_data.array[0xe] = local_b8;
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 4, 4> getGTTransformations(bool verbose)
{

  Matrix<floatPrec, 4, 4> transOut;

  // init the output
  transOut = Matrix<floatPrec, 4, 4>::Identity(4, 4);

  floatPrec angX, angY, angZ;
  Matrix<floatPrec, 3, 3> rotGT;
  Matrix<floatPrec, 3, 1> tranGT;

  // generate random angles
  angX = (rand() % 200) / 5.0;
  angY = (rand() % 200) / 5.0;
  angZ = (rand() % 200) / 5.0;
  if (verbose)
    cout << "Rand() angles = (" << angX << "," << angY << "," << angZ << ")" << endl;

  // create a rotation matrix
  rotGT = AngleAxis<floatPrec>(angZ * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitZ()) *
          AngleAxis<floatPrec>(angY * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitY()) *
          AngleAxis<floatPrec>(angX * M_PI / 360, Matrix<floatPrec, 3, 1>::UnitX());
  if (verbose)
    cout << "GT Rotation Matrix: " << endl
         << rotGT << endl;
  // cout << rotGT.transpose()*rotGT << endl;

  // create a translation vector
  tranGT(0) = rand() % 200 / 10.0 - 10.0;
  tranGT(1) = rand() % 200 / 10.0 - 10.0;
  tranGT(2) = rand() % 200 / 10.0 - 10.0;
  if (verbose)
    cout << "GT Translation Vector: " << endl
         << tranGT.transpose() << endl;

  transOut.topLeftCorner(3, 3) = rotGT;
  transOut.topRightCorner(3, 1) = tranGT;

  return transOut;
}